

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmDec.c
# Opt level: O3

int Sfm_DecPeformDec3(Sfm_Dec_t *p,Abc_Obj_t *pObj)

{
  Vec_Int_t *vMap;
  int iVar1;
  uint uVar2;
  Sfm_Par_t *pSVar3;
  void **ppvVar4;
  Mio_Gate_t *pGate1;
  Mio_Gate_t *pGate2;
  char *pFans1;
  char *pFans2;
  word wVar5;
  word wVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  int (*pSupp_00) [16];
  long lVar12;
  long lVar13;
  long lVar14;
  uint uVar15;
  int iVar16;
  word *pwVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  word wVar21;
  word (*pTruth) [4];
  int local_12a4;
  ulong local_12a0;
  uint local_1294;
  int local_127c;
  Mio_Gate_t *local_1270;
  Mio_Gate_t *local_1268;
  char *local_1260;
  char *local_1258;
  timespec ts;
  Vec_Int_t vFanins;
  int nSupp [4];
  word Masks [2] [8];
  int pSupp [4] [16];
  word uTruth [4] [4];
  int pAssump [1000];
  
  pSVar3 = p->pPars;
  if (pSVar3->fPrintDecs == 0) {
    if (pSVar3->fArea != 0) goto LAB_004b95dd;
    uVar10 = pSVar3->nDecMax;
    uVar15 = 1;
    if (1 < (int)uVar10) {
      uVar15 = uVar10;
    }
    iVar16 = pSVar3->fVeryVerbose;
    p->DelayMin = 0;
    if (iVar16 == 0) {
      bVar7 = false;
      goto LAB_004b8e28;
    }
  }
  else {
    if (pSVar3->fArea != 0) {
LAB_004b95dd:
      __assert_fail("p->pPars->fArea == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmDec.c"
                    ,0x4b8,"int Sfm_DecPeformDec3(Sfm_Dec_t *, Abc_Obj_t *)");
    }
    uVar15 = 1;
    if (1 < pSVar3->nDecMax) {
      uVar15 = pSVar3->nDecMax;
    }
    p->DelayMin = 0;
  }
  printf("\nNode %4d : MFFC %2d\n",(ulong)(uint)p->iTarget,(ulong)(uint)p->nMffc);
  uVar10 = p->pPars->nDecMax;
  bVar7 = true;
LAB_004b8e28:
  if (4 < (int)uVar10) {
    __assert_fail("p->pPars->nDecMax <= SFM_DEC_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmDec.c"
                  ,0x4be,"int Sfm_DecPeformDec3(Sfm_Dec_t *, Abc_Obj_t *)");
  }
  Sfm_ObjSetupSimInfo(pObj);
  (p->vObjDec).nSize = 0;
  vMap = &p->vObjMap;
  local_1294 = 0xffffffff;
  local_12a0 = 0;
  local_1258 = (char *)0x0;
  local_1260 = (char *)0x0;
  local_1268 = (Mio_Gate_t *)0x0;
  local_1270 = (Mio_Gate_t *)0x0;
  iVar16 = 0;
  do {
    if (p->pMit == (Sfm_Mit_t *)0x0) {
      local_12a4 = Sfm_TimReadObjDelay(p->pTim,pObj->Id);
    }
    else {
      local_12a4 = Sfm_MitReadObjDelay(p->pMit,pObj->Id);
    }
    iVar8 = (p->vObjDec).nSize;
    if (iVar16 < iVar8) {
      (p->vObjDec).nSize = iVar16;
      iVar8 = iVar16;
    }
    uVar10 = p->nPats[0];
    uVar11 = (ulong)uVar10;
    if (0x200 < uVar11) {
LAB_004b959f:
      __assert_fail("nBits >= 0 && nBits <= nWords * 64",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilTruth.h"
                    ,0xc6,"void Abc_TtMask(word *, int, int)");
    }
    pTruth = uTruth + local_12a0;
    iVar16 = iVar8 + 1;
    pwVar17 = Masks[0];
    uVar18 = uVar11;
    uVar20 = 0;
    do {
      uVar19 = uVar20 + 0x40;
      wVar21 = 0xffffffffffffffff;
      if (uVar11 < uVar19) {
        if (uVar20 < uVar11) {
          if (0x40 < uVar18) goto LAB_004b9580;
          wVar21 = 0xffffffffffffffff >> (0x40U - (char)uVar10 & 0x3f);
        }
        else {
          wVar21 = 0;
        }
      }
      *pwVar17 = wVar21;
      uVar18 = uVar18 - 0x40;
      pwVar17 = pwVar17 + 1;
      uVar20 = uVar19;
    } while (uVar19 != 0x200);
    uVar10 = p->nPats[1];
    uVar11 = (ulong)uVar10;
    if (0x200 < uVar11) goto LAB_004b959f;
    pwVar17 = Masks[1];
    uVar18 = uVar11;
    uVar20 = 0;
    do {
      uVar19 = uVar20 + 0x40;
      wVar21 = 0xffffffffffffffff;
      if (uVar11 < uVar19) {
        if (uVar20 < uVar11) {
          if (0x40 < uVar18) {
LAB_004b9580:
            __assert_fail("nBits >= 0 && nBits <= 64",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilTruth.h"
                          ,0xc2,"word Abc_Tt6Mask(int)");
          }
          wVar21 = 0xffffffffffffffff >> (0x40U - (char)uVar10 & 0x3f);
        }
        else {
          wVar21 = 0;
        }
      }
      *pwVar17 = wVar21;
      uVar18 = uVar18 - 0x40;
      pwVar17 = pwVar17 + 1;
      uVar20 = uVar19;
    } while (uVar19 != 0x200);
    pSupp_00 = pSupp + local_12a0;
    iVar8 = Sfm_DecPeformDec_rec(p,*pTruth,*pSupp_00,pAssump,0,Masks,1,0);
    nSupp[local_12a0] = iVar8;
    if (iVar8 == -2) {
LAB_004b9124:
      if (bVar7) {
        printf("Dec  %d: Pat0 = %2d  Pat1 = %2d  NO DEC.\n",local_12a0,(ulong)(uint)p->nPats[0],
               (ulong)(uint)p->nPats[1]);
      }
    }
    else {
      if (bVar7) {
        printf("Dec  %d: Pat0 = %2d  Pat1 = %2d  Supp = %d  ",local_12a0,(ulong)(uint)p->nPats[0],
               (ulong)(uint)p->nPats[1]);
        Dau_DsdPrintFromTruth(*pTruth,iVar8);
      }
      if ((iVar8 == 1 && p->pTim != (Sfm_Tim_t *)0x0) && ((*pTruth)[0] == 0x5555555555555555)) {
        iVar9 = (*pSupp_00)[0];
        if (((long)iVar9 < 0) || ((p->vObjMap).nSize <= iVar9)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar1 = p->DelayInv;
        iVar9 = (p->vObjMap).pArray[iVar9];
        if (p->pMit == (Sfm_Mit_t *)0x0) {
          iVar9 = Sfm_TimReadObjDelay(p->pTim,iVar9);
        }
        else {
          iVar9 = Sfm_MitReadObjDelay(p->pMit,iVar9);
        }
        if (local_12a4 <= iVar9 + iVar1) goto LAB_004b9124;
      }
      if (p->pMit == (Sfm_Mit_t *)0x0) {
        if (iVar8 < 2) goto LAB_004b94bb;
      }
      else {
        if (iVar8 == 1) {
          if ((*pTruth)[0] != 0x5555555555555555) {
LAB_004b94bb:
            p->nSuppVars = iVar8;
            wVar21 = (*pTruth)[0];
            wVar5 = uTruth[local_12a0][1];
            wVar6 = uTruth[local_12a0][3];
            p->Copy[2] = uTruth[local_12a0][2];
            p->Copy[3] = wVar6;
            p->Copy[0] = wVar21;
            p->Copy[1] = wVar5;
            iVar16 = Sfm_LibImplementSimple
                               (p->pLib,*pTruth,*pSupp_00,iVar8,&p->vObjGates,&p->vObjFanins);
            if (p->pPars->nVarMax < iVar8) {
              __assert_fail("nSupp[i] <= p->pPars->nVarMax",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmDec.c"
                            ,0x4e8,"int Sfm_DecPeformDec3(Sfm_Dec_t *, Abc_Obj_t *)");
            }
            p->nLuckySizes[iVar8] = p->nLuckySizes[iVar8] + 1;
            if (iVar16 < 3) {
              p->nLuckyGates[iVar16] = p->nLuckyGates[iVar16] + 1;
              return iVar16;
            }
            __assert_fail("RetValue <= 2",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmDec.c"
                          ,0x4ea,"int Sfm_DecPeformDec3(Sfm_Dec_t *, Abc_Obj_t *)");
          }
          goto LAB_004b9124;
        }
        if (iVar8 < 2) goto LAB_004b94bb;
        Sfm_DecPrepareVec(vMap,*pSupp_00,iVar8,&p->vTemp);
        Sfm_DecMffcAreaReal(pObj,&p->vTemp,&p->vTemp3);
      }
      p->nSuppVars = iVar8;
      wVar21 = (*pTruth)[0];
      wVar5 = uTruth[local_12a0][1];
      wVar6 = uTruth[local_12a0][3];
      p->Copy[2] = uTruth[local_12a0][2];
      p->Copy[3] = wVar6;
      p->Copy[0] = wVar21;
      p->Copy[1] = wVar5;
      uVar10 = Sfm_LibFindDelayMatches
                         (p->pLib,*pTruth,*pSupp_00,iVar8,&p->vMatchGates,&p->vMatchFans);
      if (0 < (int)uVar10) {
        lVar14 = 0;
        local_127c = 0;
        do {
          iVar9 = clock_gettime(3,(timespec *)&ts);
          if (iVar9 < 0) {
            lVar12 = 1;
          }
          else {
            lVar12 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
            lVar12 = ((lVar12 >> 7) - (lVar12 >> 0x3f)) + ts.tv_sec * -1000000;
          }
          uVar2 = (p->vMatchGates).nSize;
          if (((((int)uVar2 <= (int)lVar14) || ((ulong)uVar2 <= lVar14 + 1U)) ||
              (uVar2 = (p->vMatchFans).nSize, (int)uVar2 <= (int)lVar14)) ||
             ((ulong)uVar2 <= lVar14 + 1U)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          ppvVar4 = (p->vMatchGates).pArray;
          pGate1 = (Mio_Gate_t *)ppvVar4[lVar14];
          pGate2 = (Mio_Gate_t *)ppvVar4[lVar14 + 1];
          ppvVar4 = (p->vMatchFans).pArray;
          pFans1 = (char *)ppvVar4[lVar14];
          pFans2 = (char *)ppvVar4[lVar14 + 1];
          vFanins.nCap = iVar8;
          vFanins.nSize = iVar8;
          vFanins.pArray = *pSupp_00;
          if (p->pMit == (Sfm_Mit_t *)0x0) {
            iVar9 = Sfm_TimEvalRemapping(p->pTim,&vFanins,vMap,pGate1,pFans1,pGate2,pFans2);
            if (iVar9 < local_12a4) {
              local_12a4 = iVar9;
              local_1294 = (uint)local_12a0;
              local_1270 = pGate1;
              local_1268 = pGate2;
              local_1260 = pFans1;
              local_1258 = pFans2;
            }
          }
          else {
            iVar9 = Sfm_MitEvalRemapping
                              (p->pMit,&p->vTemp3,pObj,&vFanins,vMap,pGate1,pFans1,pGate2,pFans2);
            if (local_127c < iVar9) {
              local_1294 = (uint)local_12a0;
              local_127c = iVar9;
              local_1270 = pGate1;
              local_1268 = pGate2;
              local_1260 = pFans1;
              local_1258 = pFans2;
            }
          }
          iVar9 = clock_gettime(3,(timespec *)&ts);
          if (iVar9 < 0) {
            lVar13 = -1;
          }
          else {
            lVar13 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
          }
          p->timeEval = p->timeEval + lVar13 + lVar12;
          lVar14 = lVar14 + 2;
        } while ((ulong)uVar10 * 2 != lVar14);
      }
    }
    local_12a0 = local_12a0 + 1;
    if (local_12a0 == uVar15) {
      Sfm_ObjSetdownSimInfo((Abc_Obj_t *)pObj->pNtk->pData);
      if (local_1294 == 0xffffffff) {
        if (bVar7) {
          puts("Best  : NO DEC.");
        }
        p->nNoDecs = p->nNoDecs + 1;
        iVar16 = -2;
      }
      else {
        lVar14 = (long)(int)local_1294;
        if (bVar7) {
          printf("Best %d: %d  ",(ulong)local_1294,(ulong)(uint)nSupp[lVar14]);
        }
        iVar16 = Sfm_LibImplementGatesDelay
                           (p->pLib,pSupp[lVar14],local_1270,local_1268,local_1260,local_1258,
                            &p->vObjGates,&p->vObjFanins);
        if (p->pPars->nVarMax < nSupp[lVar14]) {
          __assert_fail("nSupp[iBest] <= p->pPars->nVarMax",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmDec.c"
                        ,0x530,"int Sfm_DecPeformDec3(Sfm_Dec_t *, Abc_Obj_t *)");
        }
        p->nLuckySizes[nSupp[lVar14]] = p->nLuckySizes[nSupp[lVar14]] + 1;
        if (2 < iVar16) {
          __assert_fail("RetValue <= 2",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmDec.c"
                        ,0x532,"int Sfm_DecPeformDec3(Sfm_Dec_t *, Abc_Obj_t *)");
        }
        p->nLuckyGates[iVar16] = p->nLuckyGates[iVar16] + 1;
        p->DelayMin = local_12a4;
        iVar16 = 1;
      }
      return iVar16;
    }
  } while( true );
}

Assistant:

int Sfm_DecPeformDec3( Sfm_Dec_t * p, Abc_Obj_t * pObj )
{
    word uTruth[SFM_DEC_MAX][SFM_WORD_MAX], Masks[2][SFM_SIM_WORDS];
    int pSupp[SFM_DEC_MAX][2*SFM_SUPP_MAX];
    int nSupp[SFM_DEC_MAX], pAssump[SFM_WIN_MAX];
    int fVeryVerbose = p->pPars->fPrintDecs || p->pPars->fVeryVerbose;
    int nDecs = Abc_MaxInt(p->pPars->nDecMax, 1);
    int i, k, DelayOrig = 0, DelayMin, GainMax, nMatches, iBest = -1, RetValue, Prev = 0; 
    Mio_Gate_t * pGate1Best = NULL, * pGate2Best = NULL; 
    char * pFans1Best = NULL, * pFans2Best = NULL;
    assert( p->pPars->fArea == 0 );
    p->DelayMin = 0;
    //Sfm_DecPrint( p, NULL );
    if ( fVeryVerbose )
        printf( "\nNode %4d : MFFC %2d\n", p->iTarget, p->nMffc );
    // set limit on search for decompositions in delay-model
    assert( p->pPars->nDecMax <= SFM_DEC_MAX );
    Sfm_ObjSetupSimInfo( pObj );
    Vec_IntClear( &p->vObjDec );
    for ( i = 0; i < nDecs; i++ )
    {
        GainMax = 0;
        DelayMin = DelayOrig = Sfm_ManReadObjDelay( p, Abc_ObjId(pObj) );
        // reduce the variable array
        if ( Vec_IntSize(&p->vObjDec) > Prev )
            Vec_IntShrink( &p->vObjDec, Prev );
        Prev = Vec_IntSize(&p->vObjDec) + 1;
        // perform decomposition 
        Abc_TtMask( Masks[0], SFM_SIM_WORDS, p->nPats[0] );
        Abc_TtMask( Masks[1], SFM_SIM_WORDS, p->nPats[1] );        
        nSupp[i] = Sfm_DecPeformDec_rec( p, uTruth[i], pSupp[i], pAssump, 0, Masks, 1, 0 );
        if ( nSupp[i] == -2 )
        {
            if ( fVeryVerbose )
                printf( "Dec  %d: Pat0 = %2d  Pat1 = %2d  NO DEC.\n", i, p->nPats[0], p->nPats[1] );
            continue;
        }
        if ( fVeryVerbose )
            printf( "Dec  %d: Pat0 = %2d  Pat1 = %2d  Supp = %d  ", i, p->nPats[0], p->nPats[1], nSupp[i] );
        if ( fVeryVerbose )
            Dau_DsdPrintFromTruth( uTruth[i], nSupp[i] );
        if ( p->pTim && nSupp[i] == 1 && uTruth[i][0] == ABC_CONST(0x5555555555555555) && DelayMin <= p->DelayInv + Sfm_ManReadObjDelay(p, Vec_IntEntry(&p->vObjMap, pSupp[i][0])) )
        {
            if ( fVeryVerbose )
                printf( "Dec  %d: Pat0 = %2d  Pat1 = %2d  NO DEC.\n", i, p->nPats[0], p->nPats[1] );
            continue;
        }
        if ( p->pMit && nSupp[i] == 1 && uTruth[i][0] == ABC_CONST(0x5555555555555555) )
        {
            if ( fVeryVerbose )
                printf( "Dec  %d: Pat0 = %2d  Pat1 = %2d  NO DEC.\n", i, p->nPats[0], p->nPats[1] );
            continue;
        }
        if ( nSupp[i] < 2 )
        {
            p->nSuppVars = nSupp[i];
            Abc_TtCopy( p->Copy, uTruth[i], SFM_WORD_MAX, 0 ); 
            RetValue = Sfm_LibImplementSimple( p->pLib, uTruth[i], pSupp[i], nSupp[i], &p->vObjGates, &p->vObjFanins );
            assert( nSupp[i] <= p->pPars->nVarMax );
            p->nLuckySizes[nSupp[i]]++;
            assert( RetValue <= 2 );
            p->nLuckyGates[RetValue]++;
            return RetValue;
        }

        // get MFFC
        if ( p->pMit )
        {
            Sfm_DecPrepareVec( &p->vObjMap, pSupp[i], nSupp[i], &p->vTemp ); // returns cut in p->vTemp
            Sfm_DecMffcAreaReal(pObj, &p->vTemp, &p->vTemp3 ); // returns MFFC in p->vTemp3
        }

        // try the delay
        p->nSuppVars = nSupp[i];
        Abc_TtCopy( p->Copy, uTruth[i], SFM_WORD_MAX, 0 ); 
        nMatches = Sfm_LibFindDelayMatches( p->pLib, uTruth[i], pSupp[i], nSupp[i], &p->vMatchGates, &p->vMatchFans );
        for ( k = 0; k < nMatches; k++ )
        {
            abctime clk = Abc_Clock();
            Mio_Gate_t * pGate1 = (Mio_Gate_t *)Vec_PtrEntry( &p->vMatchGates, 2*k+0 );
            Mio_Gate_t * pGate2 = (Mio_Gate_t *)Vec_PtrEntry( &p->vMatchGates, 2*k+1 );
            char * pFans1 = (char *)Vec_PtrEntry( &p->vMatchFans, 2*k+0 );
            char * pFans2 = (char *)Vec_PtrEntry( &p->vMatchFans, 2*k+1 );
            Vec_Int_t vFanins = { nSupp[i], nSupp[i], pSupp[i] };
            // skip identical gate
            //if ( pGate2 == NULL && pGate1 == (Mio_Gate_t *)pObj->pData )
            //    continue;
            if ( p->pMit )
            {
                int Gain = Sfm_MitEvalRemapping( p->pMit, &p->vTemp3, pObj, &vFanins, &p->vObjMap, pGate1, pFans1, pGate2, pFans2 );
                if ( GainMax < Gain )
                {
                    GainMax    = Gain;
                    pGate1Best = pGate1;
                    pGate2Best = pGate2;
                    pFans1Best = pFans1;
                    pFans2Best = pFans2;
                    iBest      = i;
                }
            }
            else
            {
                int Delay = Sfm_TimEvalRemapping( p->pTim, &vFanins, &p->vObjMap, pGate1, pFans1, pGate2, pFans2 );
                if ( DelayMin > Delay )
                {
                    DelayMin   = Delay;
                    pGate1Best = pGate1;
                    pGate2Best = pGate2;
                    pFans1Best = pFans1;
                    pFans2Best = pFans2;
                    iBest      = i;
                }
            }
            p->timeEval += Abc_Clock() - clk;
        }
    }
//printf( "Gain max = %d.\n", GainMax );
    Sfm_ObjSetdownSimInfo( pObj );
    if ( iBest == -1 )
    {
        if ( fVeryVerbose )
            printf( "Best  : NO DEC.\n" );
        p->nNoDecs++;
        return -2;
    }
    if ( fVeryVerbose )
        printf( "Best %d: %d  ", iBest, nSupp[iBest] );
//    if ( fVeryVerbose )
//        Dau_DsdPrintFromTruth( uTruth[iBest], nSupp[iBest] );
    RetValue = Sfm_LibImplementGatesDelay( p->pLib, pSupp[iBest], pGate1Best, pGate2Best, pFans1Best, pFans2Best, &p->vObjGates, &p->vObjFanins );
    assert( nSupp[iBest] <= p->pPars->nVarMax );
    p->nLuckySizes[nSupp[iBest]]++;
    assert( RetValue <= 2 );
    p->nLuckyGates[RetValue]++;
    p->DelayMin = DelayMin;
    return 1;
}